

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_x509.cc
# Opt level: O0

X509 * SSL_get_peer_certificate(SSL *s)

{
  SSL_SESSION *pSVar1;
  SSL_SESSION *session;
  SSL *ssl_local;
  
  bssl::check_ssl_x509_method((SSL *)s);
  if (s == (SSL *)0x0) {
    ssl_local = (SSL *)0x0;
  }
  else {
    pSVar1 = SSL_get_session(s);
    if ((pSVar1 == (SSL_SESSION *)0x0) || (*(long *)(pSVar1->krb5_client_princ + 0x18) == 0)) {
      ssl_local = (SSL *)0x0;
    }
    else {
      X509_up_ref(*(X509 **)(pSVar1->krb5_client_princ + 0x18));
      ssl_local = *(SSL **)(pSVar1->krb5_client_princ + 0x18);
    }
  }
  return (X509 *)ssl_local;
}

Assistant:

X509 *SSL_get_peer_certificate(const SSL *ssl) {
  check_ssl_x509_method(ssl);
  if (ssl == NULL) {
    return NULL;
  }
  SSL_SESSION *session = SSL_get_session(ssl);
  if (session == NULL || session->x509_peer == NULL) {
    return NULL;
  }
  X509_up_ref(session->x509_peer);
  return session->x509_peer;
}